

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

uint32_t __thiscall
cfd::Psbt::AddTxOutData(Psbt *this,Amount *amount,Address *address,KeyData *key_data)

{
  uint uVar1;
  Script *in_RDI;
  wally_psbt *psbt_pointer;
  CfdException *except;
  uint32_t index;
  Script *in_stack_ffffffffffffff20;
  Amount local_60 [60];
  uint local_24;
  
  cfd::core::Address::GetLockingScript();
  uVar1 = cfd::core::Psbt::AddTxOut(in_RDI,local_60);
  core::Script::~Script(in_stack_ffffffffffffff20);
  local_24 = uVar1;
  cfd::core::Psbt::SetTxOutData((uint)in_RDI,(KeyData *)(ulong)uVar1);
  return local_24;
}

Assistant:

uint32_t Psbt::AddTxOutData(
    const Amount& amount, const Address& address, const KeyData& key_data) {
  uint32_t index =
      cfd::core::Psbt::AddTxOut(address.GetLockingScript(), amount);
  try {
    SetTxOutData(index, key_data);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_output(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return index;
}